

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsysinfo.cpp
# Opt level: O2

bool readEtcFile(QUnixOSVersion *v,char *filename,QByteArray *idKey,QByteArray *versionKey,
                QByteArray *prettyNameKey)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  bool bVar4;
  char *pcVar5;
  qsizetype qVar6;
  char *pcVar7;
  char *pcVar8;
  char *data;
  long in_FS_OFFSET;
  QByteArrayView bv;
  QByteArrayView str;
  QByteArrayView bv_00;
  QByteArrayView str_00;
  QByteArrayView bv_01;
  QByteArrayView str_01;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char> local_78;
  QArrayDataPointer<char> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = &DAT_aaaaaaaaaaaaaaaa;
  getEtcFileContent((QByteArray *)&local_58,filename);
  qVar3 = local_58.size;
  if ((undefined1 *)local_58.size != (undefined1 *)0x0) {
    data = local_58.ptr;
    if (local_58.ptr == (char *)0x0) {
      data = &QByteArray::_empty;
    }
    local_78.d = (Data *)0x0;
    local_78.ptr = (char *)0x0;
    local_78.size = 0;
    pcVar7 = local_58.ptr + (long)(local_58.size + -1);
    pcVar8 = local_58.ptr + local_58.size;
    while (data != pcVar8) {
      pcVar5 = (char *)memchr(data,10,(long)pcVar8 - (long)data);
      if (pcVar5 == (char *)0x0) {
        pcVar5 = pcVar7;
      }
      QByteArray::setRawData((QByteArray *)&local_78,data,(long)pcVar5 - (long)data);
      bv.m_data = (idKey->d).ptr;
      bv.m_size = (idKey->d).size;
      bVar4 = QByteArray::startsWith((QByteArray *)&local_78,bv);
      if (bVar4) {
        str.m_size = (long)pcVar5 - (long)(data + (idKey->d).size);
        str.m_data = data + (idKey->d).size;
        unquote((QString *)&local_98,str);
        pDVar1 = (v->productType).d.d;
        pcVar2 = (v->productType).d.ptr;
        (v->productType).d.d = local_98.d;
        (v->productType).d.ptr = local_98.ptr;
        qVar6 = (v->productType).d.size;
        (v->productType).d.size = local_98.size;
        local_98.d = pDVar1;
        local_98.ptr = pcVar2;
LAB_00206c58:
        local_98.size = qVar6;
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
      }
      else {
        bv_00.m_data = (prettyNameKey->d).ptr;
        bv_00.m_size = (prettyNameKey->d).size;
        bVar4 = QByteArray::startsWith((QByteArray *)&local_78,bv_00);
        if (bVar4) {
          str_00.m_size = (long)pcVar5 - (long)(data + (prettyNameKey->d).size);
          str_00.m_data = data + (prettyNameKey->d).size;
          unquote((QString *)&local_98,str_00);
          pDVar1 = (v->prettyName).d.d;
          pcVar2 = (v->prettyName).d.ptr;
          (v->prettyName).d.d = local_98.d;
          (v->prettyName).d.ptr = local_98.ptr;
          qVar6 = (v->prettyName).d.size;
          (v->prettyName).d.size = local_98.size;
          local_98.d = pDVar1;
          local_98.ptr = pcVar2;
          local_98.size = qVar6;
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
        }
        else {
          bv_01.m_data = (versionKey->d).ptr;
          bv_01.m_size = (versionKey->d).size;
          bVar4 = QByteArray::startsWith((QByteArray *)&local_78,bv_01);
          if (bVar4) {
            str_01.m_size = (long)pcVar5 - (long)(data + (versionKey->d).size);
            str_01.m_data = data + (versionKey->d).size;
            unquote((QString *)&local_98,str_01);
            pDVar1 = (v->productVersion).d.d;
            pcVar2 = (v->productVersion).d.ptr;
            (v->productVersion).d.d = local_98.d;
            (v->productVersion).d.ptr = local_98.ptr;
            qVar6 = (v->productVersion).d.size;
            (v->productVersion).d.size = local_98.size;
            local_98.d = pDVar1;
            local_98.ptr = pcVar2;
            goto LAB_00206c58;
          }
        }
      }
      data = pcVar5 + 1;
    }
    QArrayDataPointer<char>::~QArrayDataPointer(&local_78);
  }
  QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (undefined1 *)qVar3 != (undefined1 *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

static bool readEtcFile(QUnixOSVersion &v, const char *filename,
                        const QByteArray &idKey, const QByteArray &versionKey, const QByteArray &prettyNameKey)
{

    QByteArray buffer = getEtcFileContent(filename);
    if (buffer.isEmpty())
        return false;

    const char *ptr = buffer.constData();
    const char *end = buffer.constEnd();
    const char *eol;
    QByteArray line;
    for (; ptr != end; ptr = eol + 1) {
        // find the end of the line after ptr
        eol = static_cast<const char *>(memchr(ptr, '\n', end - ptr));
        if (!eol)
            eol = end - 1;
        line.setRawData(ptr, eol - ptr);

        if (line.startsWith(idKey)) {
            ptr += idKey.size();
            v.productType = unquote({ptr, eol});
            continue;
        }

        if (line.startsWith(prettyNameKey)) {
            ptr += prettyNameKey.size();
            v.prettyName = unquote({ptr, eol});
            continue;
        }

        if (line.startsWith(versionKey)) {
            ptr += versionKey.size();
            v.productVersion = unquote({ptr, eol});
            continue;
        }
    }

    return true;
}